

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O1

void njd_set_accent_type(NJD *njd)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  NJDNode *pNVar7;
  NJDNode *pNVar8;
  int iVar9;
  NJDNode *node;
  int index;
  char rule [1024];
  int local_84c;
  NJD *local_848;
  char *local_840;
  undefined4 local_838;
  char local_438 [1032];
  
  if ((njd != (NJD *)0x0) && (node = njd->head, node != (NJDNode *)0x0)) {
    iVar4 = 0;
    pNVar8 = (NJDNode *)0x0;
    local_848 = njd;
    do {
      pcVar5 = NJDNode_get_string(node);
      pNVar7 = pNVar8;
      if (pcVar5 != (char *)0x0) {
        pNVar7 = node;
        iVar9 = 0;
        if ((((node != njd->head) && (iVar2 = NJDNode_get_chain_flag(node), iVar9 = 0, iVar2 == 1))
            && (pNVar7 = pNVar8, iVar9 = iVar4, node->prev != (_NJDNode *)0x0)) &&
           (iVar2 = NJDNode_get_chain_flag(node), iVar2 == 1)) {
          pcVar5 = NJDNode_get_chain_rule(node);
          local_840 = NJDNode_get_pos(node->prev);
          local_84c = 0;
          if (pcVar5 != (char *)0x0) {
            do {
              cVar1 = get_token_from_string(pcVar5,&local_84c,local_438);
              if (cVar1 == '%') {
                pcVar6 = strstr(local_840,local_438);
                if (pcVar6 != (char *)0x0) {
LAB_00171f9d:
                  if (cVar1 == '%') {
                    cVar1 = get_token_from_string(pcVar5,&local_84c,(char *)&local_838);
                  }
                  else {
                    strcpy((char *)&local_838,local_438);
                  }
                  iVar2 = 0;
                  if (cVar1 == '@') {
                    get_token_from_string(pcVar5,&local_84c,local_438);
                    iVar2 = atoi(local_438);
                  }
                  goto LAB_00171df3;
                }
              }
              else if (((cVar1 == '\0') || (cVar1 == '/')) || (cVar1 == '@')) goto LAB_00171f9d;
              while ((cVar1 == '%' || (cVar1 == '@'))) {
                cVar1 = get_token_from_string(pcVar5,&local_84c,local_438);
              }
            } while (cVar1 != '\0');
          }
          local_838 = CONCAT22(local_838._2_2_,0x2a);
          iVar2 = 0;
LAB_00171df3:
          njd = local_848;
          if (((short)local_838 != 0x2a) && (local_838._2_1_ != '\0' || (short)local_838 != 0x3146))
          {
            if (local_838._2_1_ == '\0' && (short)local_838 == 0x3246) {
              iVar3 = NJDNode_get_acc(pNVar8);
              if (iVar3 == 0) goto LAB_00172043;
            }
            else {
              if (local_838._2_1_ == '\0' && (short)local_838 == 0x3346) {
                iVar3 = NJDNode_get_acc(pNVar8);
                if (iVar3 == 0) goto LAB_00172056;
LAB_00172043:
                iVar2 = iVar2 + iVar4;
              }
              else {
                if (local_838._2_1_ == '\0' && (short)local_838 == 0x3446) goto LAB_00172043;
                if (local_838._2_1_ == '\0' && (short)local_838 == 0x3546) {
LAB_00172012:
                  iVar2 = 0;
                }
                else {
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3143) goto LAB_00172039;
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3243) {
LAB_0017261c:
                    iVar2 = iVar4 + 1;
                  }
                  else {
                    iVar2 = iVar4;
                    if (local_838._2_1_ != '\0' || (short)local_838 != 0x3343) {
                      if (local_838._2_1_ == '\0' && (short)local_838 == 0x3443) goto LAB_00172012;
                      if (local_838._2_1_ == '\0' && (short)local_838 == 0x3543) goto LAB_00172056;
                      if (local_838._2_1_ == '\0' && (short)local_838 == 0x3150) {
                        iVar3 = NJDNode_get_acc(node);
                        iVar2 = 0;
                        if (iVar3 == 0) goto LAB_00172046;
                      }
                      else if (local_838._2_1_ == '\0' && (short)local_838 == 0x3250) {
                        iVar2 = NJDNode_get_acc(node);
                        if (iVar2 == 0) goto LAB_0017261c;
                      }
                      else {
                        iVar2 = 0;
                        if (local_838._2_1_ == '\0' && (short)local_838 == 0x3650)
                        goto LAB_00172046;
                        if ((local_838 != 0x343150) || (iVar2 = NJDNode_get_acc(node), iVar2 == 0))
                        goto LAB_00172056;
                      }
LAB_00172039:
                      iVar2 = NJDNode_get_acc(node);
                      goto LAB_00172043;
                    }
                  }
                }
              }
LAB_00172046:
              NJDNode_set_acc(pNVar8,iVar2);
            }
          }
        }
LAB_00172056:
        if ((node->prev != (_NJDNode *)0x0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 == 1)) {
          pcVar5 = NJDNode_get_pos_group1(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_1354be + 9);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos_group1(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_1354be + 9);
            if (iVar4 == 0) {
              pcVar5 = NJDNode_get_string(node);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_1339b1);
              if (iVar4 == 0) {
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_133a94);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_1339bc);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_133b2a);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_135338);
                        if (iVar4 != 0) {
                          NJDNode_get_string(node->prev);
                        }
                      }
                    }
                  }
                }
                NJDNode_set_acc(node->prev,1);
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_1338fe);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_133914);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_133b0c);
                      if (iVar4 != 0) goto LAB_001725a9;
                    }
                  }
                  if ((node->next != (NJDNode *)0x0) &&
                     (pcVar5 = NJDNode_get_string(node->next), pcVar5 != (char *)0x0)) {
                    pcVar5 = NJDNode_get_string(node->next);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_133984);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->next);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_1338e8);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->next);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_133a94);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->next);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_1339bc);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->next);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_1338fe);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->next);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_133914);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->next);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_133aee);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->next);
                                  iVar4 = strcmp(pcVar5,anon_var_dwarf_133b0c);
                                  if (iVar4 != 0) {
                                    pcVar5 = NJDNode_get_string(node->next);
                                    iVar4 = strcmp(pcVar5,anon_var_dwarf_133b2a);
                                    if (iVar4 != 0) goto LAB_001725a9;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    pNVar8 = node->prev;
                    iVar4 = 0;
                    goto LAB_001725a4;
                  }
                }
              }
              else {
                pcVar5 = NJDNode_get_string(node);
                iVar4 = strcmp(pcVar5,anon_var_dwarf_133fc2);
                if (iVar4 == 0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_133aee);
                    if (iVar4 == 0) goto LAB_0017259b;
                  }
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_133a94);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_1339bc);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_133b2a);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_135338);
                          if (iVar4 != 0) goto LAB_001724c7;
                        }
                      }
                    }
                    goto LAB_00172590;
                  }
LAB_001724c7:
                  pNVar8 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar8);
                  iVar2 = NJDNode_get_mora_size(node);
                  iVar4 = iVar4 + iVar2;
                }
                else {
                  pcVar5 = NJDNode_get_string(node);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_135320);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_13532c);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_135418);
                      if (iVar4 == 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_133984);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_133914);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->prev);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_133aee);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->prev);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_133b0c);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->prev);
                                  pcVar6 = anon_var_dwarf_1353f5;
                                  goto LAB_00172587;
                                }
                              }
                            }
                          }
                          goto LAB_0017259b;
                        }
                      }
                      else {
                        pcVar5 = NJDNode_get_string(node);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_135423);
                        if (iVar4 != 0) goto LAB_001725a9;
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_133914);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            pcVar6 = anon_var_dwarf_133aee;
LAB_00172587:
                            iVar4 = strcmp(pcVar5,pcVar6);
                            if (iVar4 != 0) goto LAB_00172590;
                          }
LAB_0017259b:
                          pNVar8 = node->prev;
                          iVar4 = 2;
                          goto LAB_001725a4;
                        }
                      }
LAB_00172590:
                      pNVar8 = node->prev;
                      iVar4 = 1;
                      goto LAB_001725a4;
                    }
                  }
                  pNVar8 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar8);
                  iVar4 = iVar4 + 1;
                }
LAB_001725a4:
                NJDNode_set_acc(pNVar8,iVar4);
              }
            }
          }
        }
LAB_001725a9:
        pcVar5 = NJDNode_get_string(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_1339b1);
        if (((iVar4 == 0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 != 1)) &&
           (node->next != (NJDNode *)0x0)) {
          pcVar5 = NJDNode_get_pos_group1(node->next);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_1354be + 9);
          if (iVar4 == 0) {
            NJDNode_set_acc(node,0);
          }
        }
        iVar4 = NJDNode_get_mora_size(node);
        iVar4 = iVar4 + iVar9;
      }
      node = node->next;
      pNVar8 = pNVar7;
    } while (node != (_NJDNode *)0x0);
  }
  return;
}

Assistant:

void njd_set_accent_type(NJD * njd)
{
   NJDNode *node;
   NJDNode *top_node = NULL;
   char rule[MAXBUFLEN];
   int add_type = 0;
   int mora_size = 0;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_string(node) == NULL)
         continue;
      if ((node == njd->head) || (NJDNode_get_chain_flag(node) != 1)) {
         /* store the top node */
         top_node = node;
         mora_size = 0;
      } else if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1) {
         /* get accent change type */
         get_rule(NJDNode_get_chain_rule(node), NJDNode_get_pos(node->prev), rule, &add_type);

         /* change accent type */
         if (strcmp(rule, "*") == 0) {  /* no chnage */
         } else if (strcmp(rule, "F1") == 0) {  /* for ancillary word */
         } else if (strcmp(rule, "F2") == 0) {
            if (NJDNode_get_acc(top_node) == 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F3") == 0) {
            if (NJDNode_get_acc(top_node) != 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F4") == 0) {
            NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F5") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C1") == 0) {  /* for noun */
            NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "C2") == 0) {
            NJDNode_set_acc(top_node, mora_size + 1);
         } else if (strcmp(rule, "C3") == 0) {
            NJDNode_set_acc(top_node, mora_size);
         } else if (strcmp(rule, "C4") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C5") == 0) {
         } else if (strcmp(rule, "P1") == 0) {  /* for postfix */
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, 0);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P2") == 0) {
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, mora_size + 1);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P6") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "P14") == 0) {
            if (NJDNode_get_acc(node) != 0)
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         }
      }

      /* change accent type for digit */
      if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1 &&
          strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_TYPE_KAZU) == 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0) { /* 10^1 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SUU) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_GO) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0)) {
               if (node->next != NULL && NJDNode_get_string(node->next) != NULL
                   && (strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ICHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_SAN) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_YON) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_GO) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ROKU) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NANA) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_HACHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_KYUU) == 0))
                  NJDNode_set_acc(node->prev, 0);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_HYAKU) == 0) { /* 10^2 */
            if (NJDNode_get_string(node->prev) != NULL
                && strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0) {
               NJDNode_set_acc(node->prev, 2);
            } else if (NJDNode_get_string(node->prev) != NULL &&
                       (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev,
                               NJDNode_get_mora_size(node->prev) + NJDNode_get_mora_size(node));
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_SEN) == 0) {   /* 10^3 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_MAN) == 0) {   /* 10^4 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_OKU) == 0) {   /* 10^8 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ICHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_IKU) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_CHOU) == 0) {  /* 10^12 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         }
      }

      if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0 &&
          NJDNode_get_chain_flag(node) != 1 && node->next != NULL &&
          strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         NJDNode_set_acc(node, 0);
      }

      mora_size += NJDNode_get_mora_size(node);
   }
}